

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor_cursor.hpp
# Opt level: O1

void __thiscall
jsoncons::cbor::basic_cbor_cursor<jsoncons::bytes_source,_std::allocator<char>_>::
basic_cbor_cursor<jsoncons::bytes_source>
          (basic_cbor_cursor<jsoncons::bytes_source,_std::allocator<char>_> *this,
          bytes_source *source,cbor_decode_options *options,allocator<char> *alloc)

{
  int iVar1;
  
  (this->super_basic_staj_cursor<char>)._vptr_basic_staj_cursor = (_func_int **)0xb5b8b8;
  *(undefined8 *)&this->field_0x238 = 0xb5b958;
  basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_>::
  basic_cbor_parser<jsoncons::bytes_source>(&this->parser_,source,options,alloc);
  (this->cursor_visitor_).super_basic_json_visitor<char>._vptr_basic_json_visitor =
       (_func_int **)&PTR__basic_json_visitor_00b59940;
  (this->cursor_visitor_).event_.event_type_ = null_value;
  (this->cursor_visitor_).event_.tag_ = none;
  (this->cursor_visitor_).data_.type_ = 0;
  (this->cursor_visitor_).event_.ext_tag_ = 0;
  (this->cursor_visitor_).event_.value_.int64_value_ = 0;
  *(undefined8 *)((long)&(this->cursor_visitor_).event_.value_ + 4) = 0;
  *(undefined8 *)((long)&(this->cursor_visitor_).event_.length_ + 4) = 0;
  (this->cursor_visitor_).data_.data_.uint8_data_ = (uint8_t *)0x0;
  (this->cursor_visitor_).data_.size_ = 0;
  (this->cursor_visitor_).shape_.data_ = (pointer)0x0;
  (this->cursor_visitor_).shape_.size_ = 0;
  (this->cursor_visitor_).index_ = 0;
  basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::
  basic_item_event_visitor_to_json_visitor
            (&this->cursor_handler_adaptor_,&(this->cursor_visitor_).super_basic_json_visitor<char>,
             alloc);
  this->eof_ = false;
  (this->parser_).cursor_mode_ = true;
  iVar1 = (*(this->super_basic_staj_cursor<char>)._vptr_basic_staj_cursor[3])(this);
  if ((char)iVar1 == '\0') {
    (*(this->super_basic_staj_cursor<char>)._vptr_basic_staj_cursor[7])(this);
  }
  return;
}

Assistant:

basic_cbor_cursor(Sourceable&& source,
        const cbor_decode_options& options = cbor_decode_options(),
        const Allocator& alloc = Allocator())
        : parser_(std::forward<Sourceable>(source), options, alloc), 
          cursor_handler_adaptor_(cursor_visitor_, alloc)
    {
        parser_.cursor_mode(true);
        if (!done())
        {
            next();
        }
    }